

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O1

Expression * __thiscall slang::ast::Expression::unwrapImplicitConversions(Expression *this)

{
  Expression *expr;
  
  while (((((Type *)this)->super_Symbol).kind == Conversion &&
         ((int)((Expression *)((long)&((Type *)this)->super_Symbol + 0x30))->kind < 2))) {
    this = (Expression *)(((Expression *)((long)&((Type *)this)->super_Symbol + 0x30))->type).ptr;
  }
  return this;
}

Assistant:

const Expression& Expression::unwrapImplicitConversions() const {
    auto expr = this;
    while (expr->kind == ExpressionKind::Conversion) {
        auto& conv = expr->as<ConversionExpression>();
        if (!conv.isImplicit())
            break;

        expr = &conv.operand();
    }
    return *expr;
}